

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::handle_read<std::__cxx11::string>
          (coro_http_client *this,error_code *ec,size_t *size,bool *is_keep_alive,
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,http_method method)

{
  char *pcVar1;
  undefined4 *puVar2;
  size_t sVar3;
  element_type *peVar4;
  char **ppcVar5;
  undefined4 in_register_0000008c;
  undefined4 in_stack_00000008;
  
  puVar2 = (undefined4 *)CONCAT44(in_register_0000008c,method);
  peVar4 = (element_type *)operator_new(0x220,(nothrow_t *)&std::nothrow);
  if (peVar4 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar4->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         handle_read<std::__cxx11::string>;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar4->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)handle_read<std::__cxx11::string>;
    *(undefined4 *)&((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x1d0))->_M_len =
         in_stack_00000008;
    *(req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      **)((long)(peVar4->parser_).headers_._M_elems + 0x1b8) = ctx;
    ((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x1b0))->_M_len =
         (size_t)is_keep_alive;
    *(size_t **)((long)(peVar4->parser_).headers_._M_elems + 0x1a8) = size;
    (((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0x1a0))->name)._M_len = (size_t)ec
    ;
    *(undefined4 *)
     &(((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0xc0))->name)._M_len = *puVar2;
    ppcVar5 = (char **)((long)(peVar4->parser_).headers_._M_elems + 0xd8);
    *(char ***)((long)(peVar4->parser_).headers_._M_elems + 200) = ppcVar5;
    pcVar1 = (char *)(puVar2 + 6);
    if (*(char **)(puVar2 + 2) == pcVar1) {
      sVar3 = *(size_t *)(puVar2 + 8);
      *ppcVar5 = *(char **)pcVar1;
      (((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0xe0))->name)._M_len = sVar3;
    }
    else {
      *(char **)((long)(peVar4->parser_).headers_._M_elems + 200) = *(char **)(puVar2 + 2);
      *(char **)((long)(peVar4->parser_).headers_._M_elems + 0xd8) = *(char **)pcVar1;
    }
    ((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0xd0))->_M_len =
         *(size_t *)(puVar2 + 4);
    *(char **)(puVar2 + 2) = pcVar1;
    *(undefined8 *)(puVar2 + 4) = 0;
    *(undefined1 *)(puVar2 + 6) = 0;
    ppcVar5 = (char **)((long)(peVar4->parser_).headers_._M_elems + 0xf8);
    *(char ***)((long)(peVar4->parser_).headers_._M_elems + 0xe8) = ppcVar5;
    pcVar1 = (char *)(puVar2 + 0xe);
    if (*(char **)(puVar2 + 10) == pcVar1) {
      sVar3 = *(size_t *)(puVar2 + 0x10);
      *ppcVar5 = *(char **)pcVar1;
      (((http_header *)((long)(peVar4->parser_).headers_._M_elems + 0x100))->name)._M_len = sVar3;
    }
    else {
      *(char **)((long)(peVar4->parser_).headers_._M_elems + 0xe8) = *(char **)(puVar2 + 10);
      *(char **)((long)(peVar4->parser_).headers_._M_elems + 0xf8) = *(char **)pcVar1;
    }
    ((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0xf0))->_M_len =
         *(size_t *)(puVar2 + 0xc);
    *(char **)(puVar2 + 10) = pcVar1;
    *(undefined8 *)(puVar2 + 0xc) = 0;
    *(undefined1 *)(puVar2 + 0xe) = 0;
    *(char **)((long)(peVar4->parser_).headers_._M_elems + 0x108) = *(char **)(puVar2 + 0x12);
    (peVar4->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar4->parser_ = 0;
    (peVar4->parser_).msg_._M_len = 0;
    *(undefined1 *)((long)(peVar4->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    *(undefined1 *)((long)(peVar4->parser_).headers_._M_elems + 0x1d4) = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> handle_read(std::error_code &ec,
                                                  size_t &size,
                                                  bool &is_keep_alive,
                                                  req_context<String> ctx,
                                                  http_method method) {
    resp_data data{};
    do {
      if (std::tie(ec, size) = co_await async_read_until(head_buf_, TWO_CRCF);
          ec) {
        break;
      }

      ec = handle_header(data, parser_, size);
      if (ec) {
        break;
      }

      is_keep_alive = parser_.keep_alive();
      if (method == http_method::HEAD) {
        co_return data;
      }

      bool is_out_buf = false;

      bool is_ranges = parser_.is_resp_ranges();
      if (is_ranges) {
        is_keep_alive = true;
      }
      if (parser_.is_chunked()) {
        out_buf_ = {};
        is_keep_alive = true;
        if (head_buf_.size() > 0) {
          const char *data_ptr =
              asio::buffer_cast<const char *>(head_buf_.data());
          chunked_buf_.sputn(data_ptr, head_buf_.size());
          head_buf_.consume(head_buf_.size());
        }
        ec = co_await handle_chunked(data, std::move(ctx));
        break;
      }

      if (parser_.is_multipart()) {
        out_buf_ = {};
        is_keep_alive = true;
        if (head_buf_.size() > 0) {
          const char *data_ptr =
              asio::buffer_cast<const char *>(head_buf_.data());
          chunked_buf_.sputn(data_ptr, head_buf_.size());
          head_buf_.consume(head_buf_.size());
        }
        ec = co_await handle_multipart(data, std::move(ctx));
        break;
      }

      redirect_uri_.clear();
      bool is_redirect = parser_.is_location();
      if (is_redirect)
        redirect_uri_ = parser_.get_header_value("Location");

      if (!parser_.get_header_value("Content-Encoding").empty()) {
        if (parser_.get_header_value("Content-Encoding").find("gzip") !=
            std::string_view::npos)
          encoding_type_ = content_encoding::gzip;
        else if (parser_.get_header_value("Content-Encoding").find("deflate") !=
                 std::string_view::npos)
          encoding_type_ = content_encoding::deflate;
        else if (parser_.get_header_value("Content-Encoding").find("br") !=
                 std::string_view::npos)
          encoding_type_ = content_encoding::br;
      }
      else {
        encoding_type_ = content_encoding::none;
      }

      size_t content_len = (size_t)parser_.body_len();
#ifdef BENCHMARK_TEST
      total_len_ = parser_.total_len();
#endif

      is_out_buf = !out_buf_.empty();
      if (is_out_buf) {
        if (content_len > 0 && out_buf_.size() < content_len) {
          out_buf_ = {};
          is_out_buf = false;
        }
      }

      if (content_len <= head_buf_.size()) {
        // Now get entire content, additional data will discard.
        // copy body.
        if (content_len > 0) {
          auto data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
          if (is_out_buf) {
            memcpy(out_buf_.data(), data_ptr, content_len);
          }
          else {
            detail::resize(body_, content_len);
            memcpy(body_.data(), data_ptr, content_len);
          }
          head_buf_.consume(head_buf_.size());
        }
        co_await handle_entire_content(data, content_len, is_ranges, ctx);
        break;
      }

      // read left part of content.
      size_t part_size = head_buf_.size();
      size_t size_to_read = content_len - part_size;

      auto data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
      if (is_out_buf) {
        memcpy(out_buf_.data(), data_ptr, part_size);
      }
      else {
        detail::resize(body_, content_len);
        memcpy(body_.data(), data_ptr, part_size);
      }

      head_buf_.consume(part_size);

      if (is_out_buf) {
        if (std::tie(ec, size) = co_await async_read(
                asio::buffer(out_buf_.data() + part_size, size_to_read),
                size_to_read);
            ec) {
          break;
        }
      }
      else {
        if (std::tie(ec, size) = co_await async_read(
                asio::buffer(body_.data() + part_size, size_to_read),
                size_to_read);
            ec) {
          break;
        }
      }

      // Now get entire content, additional data will discard.
      co_await handle_entire_content(data, content_len, is_ranges, ctx);
    } while (0);

    if (!resp_chunk_str_.empty()) {
      data.resp_body =
          std::string_view{resp_chunk_str_.data(), resp_chunk_str_.size()};
    }

    co_return data;
  }